

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

bool Rml::ElementUtilities::GetBoundingBox
               (Rectanglef *out_rectangle,Element *element,BoxArea box_area)

{
  code *pcVar1;
  Vector2f pos;
  Vector2f size;
  Vector2<float> VVar2;
  bool bVar3;
  Property *pPVar4;
  Type TVar5;
  vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *this;
  reference pBVar6;
  Box *this_00;
  TransformState *this_01;
  Context *this_02;
  float fVar7;
  float fVar8;
  float y;
  Rectangle<float> RVar9;
  VectorType VVar10;
  Matrix4<float,_Rml::ColumnMajorStorage<float>_> *local_2b0;
  int local_27c;
  int i_1;
  Vector2<float> local_260;
  Vector2<float> local_258;
  Vector2<float> local_250;
  Vector2<float> local_244;
  Vector2<float> local_23c;
  Vector2f pos_viewport;
  Vector2<float> local_22c;
  Vector2f pos_ndc;
  float local_214;
  float fStack_210;
  Vector4f pos_clip_space;
  int i;
  bool any_vertex_depth_clipped;
  Matrix4f project_transform;
  Matrix4f project;
  float local_174;
  float fStack_170;
  Vector2f window_size;
  float z_clip;
  Vector2f corners [4];
  int num_corners;
  Context *context;
  Matrix4f *transform;
  TransformState *transform_state;
  undefined1 local_f0 [8];
  Rectanglef bounds;
  Vector2<float> local_c0;
  Vector2<float> local_b8;
  Vector2<float> local_b0;
  Vector2f local_a8;
  Vector2f local_a0;
  NumericValue local_98;
  NumericValue local_90;
  Vector2<float> local_88;
  Vector2f offset;
  float extent;
  BoxShadow *shadow;
  const_iterator __end3;
  const_iterator __begin3;
  BoxShadowList *__range3;
  BoxShadowList *shadow_list;
  Property *p_box_shadow;
  Vector2f shadow_extent_bottom_right;
  Vector2f shadow_extent_top_left;
  BoxArea box_area_local;
  Element *element_local;
  Rectanglef *out_rectangle_local;
  
  if ((element == (Element *)0x0) &&
     (bVar3 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                     ,0x104), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Vector2<float>::Vector2(&shadow_extent_bottom_right);
  Vector2<float>::Vector2((Vector2<float> *)&p_box_shadow);
  shadow_extent_top_left.y = (float)box_area;
  if (box_area == Auto) {
    shadow_extent_top_left.y = 1.4013e-45;
    pPVar4 = Element::GetLocalProperty(element,BoxShadow);
    if (pPVar4 != (Property *)0x0) {
      TVar5 = Variant::GetType(&pPVar4->value);
      if ((TVar5 != BOXSHADOWLIST) &&
         (bVar3 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementUtilities.cpp"
                         ,0x10f), !bVar3)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this = Variant::GetReference<std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>>
                       (&pPVar4->value);
      __end3 = ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::begin(this);
      shadow = (BoxShadow *)
               ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::end(this);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
                                         *)&shadow), bVar3) {
        pBVar6 = __gnu_cxx::
                 __normal_iterator<const_Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
                 ::operator*(&__end3);
        if ((pBVar6->inset & 1U) == 0) {
          fVar7 = Element::ResolveLength(element,pBVar6->blur_radius);
          offset = *(Vector2f *)&pBVar6->spread_distance;
          fVar8 = Element::ResolveLength(element,(NumericValue)offset);
          fVar8 = fVar7 * 1.5 + fVar8;
          local_90 = pBVar6->offset_x;
          fVar7 = Element::ResolveLength(element,local_90);
          local_98 = pBVar6->offset_y;
          y = Element::ResolveLength(element,local_98);
          Vector2<float>::Vector2(&local_88,fVar7,y);
          local_a8 = shadow_extent_bottom_right;
          local_b8 = Vector2<float>::operator-(&local_88);
          Vector2<float>::Vector2(&local_c0,fVar8);
          local_b0 = Vector2<float>::operator+(&local_b8,local_c0);
          local_a0 = Math::Max<Rml::Vector2<float>>(local_a8,local_b0);
          pPVar4 = p_box_shadow;
          shadow_extent_bottom_right = local_a0;
          Vector2<float>::Vector2(&bounds.p1,fVar8);
          VVar2 = Vector2<float>::operator+(&local_88,bounds.p1);
          p_box_shadow = (Property *)Math::Max<Rml::Vector2<float>>((Vector2f)pPVar4,VVar2);
        }
        __gnu_cxx::
        __normal_iterator<const_Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
        ::operator++(&__end3);
      }
    }
  }
  pos = Element::GetAbsoluteOffset(element,(BoxArea)shadow_extent_top_left.y);
  this_00 = Element::GetBox(element);
  size = Box::GetSize(this_00,(BoxArea)shadow_extent_top_left.y);
  RVar9 = Rectangle<float>::FromPositionSize(pos,size);
  bounds.p0 = RVar9.p1;
  local_f0 = (undefined1  [8])RVar9.p0;
  RVar9 = Rectangle<float>::Extend
                    ((Rectangle<float> *)local_f0,shadow_extent_bottom_right,
                     (Vector2Type)p_box_shadow);
  bounds.p0 = RVar9.p1;
  local_f0 = (undefined1  [8])RVar9.p0;
  this_01 = Element::GetTransformState(element);
  if (this_01 == (TransformState *)0x0) {
    local_2b0 = (Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)0x0;
  }
  else {
    local_2b0 = TransformState::GetTransform(this_01);
  }
  if (local_2b0 == (Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)0x0) {
    (out_rectangle->p0).x = (float)local_f0._0_4_;
    (out_rectangle->p0).y = (float)local_f0._4_4_;
    out_rectangle->p1 = bounds.p0;
    out_rectangle_local._7_1_ = true;
  }
  else {
    this_02 = Element::GetContext(element);
    if (this_02 == (Context *)0x0) {
      out_rectangle_local._7_1_ = false;
    }
    else {
      unique0x10000360 = Rectangle<float>::TopLeft((Rectangle<float> *)local_f0);
      corners[0] = Rectangle<float>::TopRight((Rectangle<float> *)local_f0);
      corners[1] = Rectangle<float>::BottomRight((Rectangle<float> *)local_f0);
      corners[2] = Rectangle<float>::BottomLeft((Rectangle<float> *)local_f0);
      window_size.x = 10000.0;
      project.vectors[3]._8_8_ = Context::GetDimensions(this_02);
      VVar2 = Vector2::operator_cast_to_Vector2((Vector2 *)&project.vectors[3].z);
      local_174 = VVar2.x;
      fStack_170 = VVar2.y;
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::ProjectOrtho
                ((ThisType *)&project_transform.vectors[3].z,0.0,local_174,0.0,fStack_170,-10000.0,
                 10000.0);
      Matrix4<float,Rml::ColumnMajorStorage<float>>::operator*
                ((ThisType *)&i,
                 (Matrix4<float,Rml::ColumnMajorStorage<float>> *)&project_transform.vectors[3].z,
                 local_2b0);
      bVar3 = false;
      for (pos_clip_space.z = 0.0; (int)pos_clip_space.z < 4;
          pos_clip_space.z = (float)((int)pos_clip_space.z + 1)) {
        Vector4<float>::Vector4
                  ((Vector4<float> *)&pos_ndc,(&window_size)[(int)pos_clip_space.z].y,
                   corners[(long)(int)pos_clip_space.z + -1].y,0.0,1.0);
        VVar10 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*
                           ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)&i,
                            (Vector4<float> *)&pos_ndc);
        local_214 = VVar10.x;
        fStack_210 = VVar10.y;
        Vector2<float>::Vector2(&pos_viewport,local_214,fStack_210);
        pos_clip_space.y = VVar10.w;
        local_22c = Vector2<float>::operator/(&pos_viewport,pos_clip_space.y);
        local_250 = VVar2;
        local_244 = Rml::operator*(0.5,VVar2);
        Vector2<float>::Vector2(&local_260,1.0);
        local_258 = Vector2<float>::operator+(&local_22c,local_260);
        local_23c = Vector2<float>::operator*(&local_244,local_258);
        *(Vector2<float> *)&(&window_size)[(int)pos_clip_space.z].y = local_23c;
        pos_clip_space.x = VVar10.z;
        bVar3 = bVar3 || (pos_clip_space.x < -pos_clip_space.y ||
                         pos_clip_space.y < pos_clip_space.x);
      }
      if (bVar3) {
        out_rectangle_local._7_1_ = false;
      }
      else {
        RVar9 = Rectangle<float>::FromPosition(stack0xfffffffffffffe98);
        out_rectangle->p0 = RVar9.p0;
        out_rectangle->p1 = RVar9.p1;
        for (local_27c = 1; local_27c < 4; local_27c = local_27c + 1) {
          RVar9 = Rectangle<float>::Join(out_rectangle,*(Vector2Type *)&(&window_size)[local_27c].y)
          ;
          out_rectangle->p0 = RVar9.p0;
          out_rectangle->p1 = RVar9.p1;
        }
        out_rectangle_local._7_1_ = true;
      }
    }
  }
  return out_rectangle_local._7_1_;
}

Assistant:

bool ElementUtilities::GetBoundingBox(Rectanglef& out_rectangle, Element* element, BoxArea box_area)
{
	RMLUI_ASSERT(element);

	Vector2f shadow_extent_top_left, shadow_extent_bottom_right;
	if (box_area == BoxArea::Auto)
	{
		// 'Auto' acts like border box extended to encompass any ink overflow, including the element's box-shadow.
		// Note: Does not currently include ink overflow due to filters, as that is handled manually in ElementEffects.
		box_area = BoxArea::Border;

		if (const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow))
		{
			RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
			const BoxShadowList& shadow_list = p_box_shadow->value.GetReference<BoxShadowList>();

			for (const BoxShadow& shadow : shadow_list)
			{
				if (!shadow.inset)
				{
					const float extent = 1.5f * element->ResolveLength(shadow.blur_radius) + element->ResolveLength(shadow.spread_distance);
					const Vector2f offset = {element->ResolveLength(shadow.offset_x), element->ResolveLength(shadow.offset_y)};

					shadow_extent_top_left = Math::Max(shadow_extent_top_left, -offset + Vector2f(extent));
					shadow_extent_bottom_right = Math::Max(shadow_extent_bottom_right, offset + Vector2f(extent));
				}
			}
		}
	}

	// Element bounds in non-transformed space.
	Rectanglef bounds = Rectanglef::FromPositionSize(element->GetAbsoluteOffset(box_area), element->GetBox().GetSize(box_area));
	bounds = bounds.Extend(shadow_extent_top_left, shadow_extent_bottom_right);

	const TransformState* transform_state = element->GetTransformState();
	const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);

	// Early exit in the common case of no transform.
	if (!transform)
	{
		out_rectangle = bounds;
		return true;
	}

	Context* context = element->GetContext();
	if (!context)
		return false;

	constexpr int num_corners = 4;
	Vector2f corners[num_corners] = {
		bounds.TopLeft(),
		bounds.TopRight(),
		bounds.BottomRight(),
		bounds.BottomLeft(),
	};

	// Transform and project corners to window coordinates.
	constexpr float z_clip = 10'000.f;
	const Vector2f window_size = Vector2f(context->GetDimensions());
	const Matrix4f project = Matrix4f::ProjectOrtho(0.f, window_size.x, 0.f, window_size.y, -z_clip, z_clip);
	const Matrix4f project_transform = project * (*transform);
	bool any_vertex_depth_clipped = false;

	for (int i = 0; i < num_corners; i++)
	{
		const Vector4f pos_clip_space = project_transform * Vector4f(corners[i].x, corners[i].y, 0, 1);
		const Vector2f pos_ndc = Vector2f(pos_clip_space.x, pos_clip_space.y) / pos_clip_space.w;
		const Vector2f pos_viewport = 0.5f * window_size * (pos_ndc + Vector2f(1));
		corners[i] = pos_viewport;
		any_vertex_depth_clipped |= !(-pos_clip_space.w <= pos_clip_space.z && pos_clip_space.z <= pos_clip_space.w);
	}

	// If any part of the box area is outside the depth clip planes we give up finding the bounding box. In this situation a renderer would normally
	// clip the underlying triangles against the clip planes. We could in principle do the same, but the added complexity does not seem worthwhile for
	// our use cases.
	if (any_vertex_depth_clipped)
		return false;

	// Find the rectangle covering the projected corners.
	out_rectangle = Rectanglef::FromPosition(corners[0]);
	for (int i = 1; i < num_corners; i++)
		out_rectangle = out_rectangle.Join(corners[i]);

	return true;
}